

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

void __thiscall
Js::RecyclableArrayWalker::RecyclableArrayWalker
          (RecyclableArrayWalker *this,ScriptContext *scriptContext,Var instance,
          Var originalInstance)

{
  Var originalInstance_local;
  Var instance_local;
  ScriptContext *scriptContext_local;
  RecyclableArrayWalker *this_local;
  
  RecyclableObjectWalker::RecyclableObjectWalker
            (&this->super_RecyclableObjectWalker,scriptContext,instance,originalInstance);
  (this->super_RecyclableObjectWalker).super_IDiagObjectModelWalkerBase.
  _vptr_IDiagObjectModelWalkerBase = (_func_int **)&PTR_Get_01deaae8;
  this->indexedItemCount = 0;
  this->pAbsoluteIndexList =
       (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
       0x0;
  this->fOnlyOwnProperties = false;
  return;
}

Assistant:

RecyclableArrayWalker::RecyclableArrayWalker(ScriptContext* scriptContext, Var instance, Var originalInstance)
        : indexedItemCount(0),
          pAbsoluteIndexList(nullptr),
          fOnlyOwnProperties(false),
          RecyclableObjectWalker(scriptContext,instance,originalInstance)
    {
    }